

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.c
# Opt level: O1

int match_long(parg_state *ps,int argc,char **argv,char *optstring,parg_option *longopts,
              int *longindex)

{
  int iVar1;
  size_t __n;
  parg_option *ppVar2;
  char *__s2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  uint local_60;
  
  pcVar4 = ps->nextchar;
  __n = strcspn(pcVar4,"=");
  __s2 = longopts->name;
  uVar3 = 0;
  if (__s2 == (char *)0x0) {
    local_60 = 0xffffffff;
  }
  else {
    ppVar2 = longopts + 1;
    local_60 = 0xffffffff;
    iVar5 = 0;
    do {
      iVar1 = strncmp(pcVar4,__s2,__n);
      if (iVar1 == 0) {
        local_60 = uVar3;
        if (__s2[__n] == '\0') {
          iVar5 = 1;
          break;
        }
        iVar5 = iVar5 + 1;
      }
      __s2 = ppVar2->name;
      uVar3 = uVar3 + 1;
      ppVar2 = ppVar2 + 1;
    } while (__s2 != (char *)0x0);
    uVar3 = (uint)(iVar5 == 1);
  }
  if ((char)uVar3 == '\0') {
    ps->optopt = 0;
    ps->nextchar = (char *)0x0;
    return 0x3f;
  }
  if (local_60 == 0xffffffff) {
    __assert_fail("match != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",0x67
                  ,
                  "int match_long(struct parg_state *, int, char *const *, const char *, const struct parg_option *, int *)"
                 );
  }
  if (longindex != (int *)0x0) {
    *longindex = local_60;
  }
  if (pcVar4[__n] == '=') {
    if (longopts[(int)local_60].has_arg == 0) {
LAB_0010a753:
      iVar5 = 0;
      if (longopts[(int)local_60].flag == (int *)0x0) {
        iVar5 = longopts[(int)local_60].val;
      }
      ps->optopt = iVar5;
      ps->nextchar = (char *)0x0;
      return (uint)(*optstring != ':') * 5 + 0x3a;
    }
    pcVar4 = pcVar4 + __n + 1;
  }
  else {
    if (longopts[(int)local_60].has_arg != 1) goto LAB_0010a736;
    iVar5 = ps->optind;
    if ((argc <= iVar5) || (argv[iVar5] == (char *)0x0)) goto LAB_0010a753;
    ps->optind = iVar5 + 1;
    pcVar4 = argv[iVar5];
  }
  ps->optarg = pcVar4;
LAB_0010a736:
  ps->nextchar = (char *)0x0;
  iVar5 = longopts[(int)local_60].val;
  if (longopts[(int)local_60].flag != (int *)0x0) {
    *longopts[(int)local_60].flag = iVar5;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int
match_long(struct parg_state *ps, int argc, char *const argv[],
           const char *optstring,
           const struct parg_option *longopts, int *longindex)
{
	size_t len;
	int num_match = 0;
	int match = -1;
	int i;

	len = strcspn(ps->nextchar, "=");

	for (i = 0; longopts[i].name; ++i) {
		if (strncmp(ps->nextchar, longopts[i].name, len) == 0) {
			match = i;
			num_match++;
			/* Take if exact match */
			if (longopts[i].name[len] == '\0') {
				num_match = 1;
				break;
			}
		}
	}

	/* Return '?' on no or ambiguous match */
	if (num_match != 1) {
		ps->optopt = 0;
		ps->nextchar = NULL;
		return '?';
	}

	assert(match != -1);

	if (longindex) {
		*longindex = match;
	}

	if (ps->nextchar[len] == '=') {
		/* Option argument present, check if extraneous */
		if (longopts[match].has_arg == PARG_NOARG) {
			ps->optopt = longopts[match].flag ? 0 : longopts[match].val;
			ps->nextchar = NULL;
			return optstring[0] == ':' ? ':' : '?';
		}
		else {
			ps->optarg = &ps->nextchar[len + 1];
		}
	}
	else if (longopts[match].has_arg == PARG_REQARG) {
		/* Option argument required, so return next argv element */
		if (is_argv_end(ps, argc, argv)) {
			ps->optopt = longopts[match].flag ? 0 : longopts[match].val;
			ps->nextchar = NULL;
			return optstring[0] == ':' ? ':' : '?';
		}

		ps->optarg = argv[ps->optind++];
	}

	ps->nextchar = NULL;

	if (longopts[match].flag != NULL) {
		*longopts[match].flag = longopts[match].val;
		return 0;
	}

	return longopts[match].val;
}